

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

TupleMake * __thiscall
wasm::Builder::makeTupleMake<ArenaVector<wasm::Expression*>&>
          (Builder *this,ArenaVector<wasm::Expression_*> *operands)

{
  TupleMake *this_00;
  TupleMake *ret;
  ArenaVector<wasm::Expression_*> *operands_local;
  Builder *this_local;
  
  this_00 = MixedArena::alloc<wasm::TupleMake>(&this->wasm->allocator);
  ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
  set<ArenaVector<wasm::Expression*>>
            ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)&this_00->operands
             ,operands);
  TupleMake::finalize(this_00);
  return this_00;
}

Assistant:

TupleMake* makeTupleMake(ListType&& operands) {
    auto* ret = wasm.allocator.alloc<TupleMake>();
    ret->operands.set(operands);
    ret->finalize();
    return ret;
  }